

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  Geometry *pGVar5;
  RTCIntersectArguments *pRVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  AABBNodeMB4D *node1;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  undefined4 uVar38;
  ulong unaff_R12;
  size_t mask;
  size_t sVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  ulong uVar44;
  bool bVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  float fVar62;
  float fVar63;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar64;
  float fVar65;
  float fVar78;
  float fVar79;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar80;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  float fVar88;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar94 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar102;
  float fVar104;
  float fVar105;
  undefined1 auVar103 [16];
  float fVar106;
  float fVar107;
  float fVar109;
  uint uVar110;
  float fVar111;
  uint uVar112;
  undefined1 auVar108 [16];
  float fVar113;
  uint uVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  int local_a8c;
  undefined1 local_a88 [8];
  float fStack_a80;
  float fStack_a7c;
  undefined1 local_a78 [8];
  float fStack_a70;
  float fStack_a6c;
  undefined1 local_a68 [16];
  ulong local_a50;
  ulong local_a48;
  ulong local_a40;
  ulong local_a38;
  ulong local_a30;
  ulong local_a28;
  ulong local_a20;
  NodeRef *local_a18;
  Scene *scene;
  undefined1 local_a08 [8];
  undefined8 uStack_a00;
  undefined1 local_9f8 [8];
  float fStack_9f0;
  float fStack_9ec;
  undefined1 local_9e8 [8];
  float fStack_9e0;
  float fStack_9dc;
  ulong local_9d8;
  ulong local_9d0;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  NodeRef stack [244];
  
  auVar24 = mm_lookupmask_ps._240_16_;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar53 = ray->tfar;
    auVar94 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar53) {
      local_a18 = stack + 1;
      aVar4 = (ray->dir).field_0;
      auVar7 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar81._8_4_ = 0x7fffffff;
      auVar81._0_8_ = 0x7fffffff7fffffff;
      auVar81._12_4_ = 0x7fffffff;
      auVar81 = vandps_avx((undefined1  [16])aVar4,auVar81);
      auVar89._8_4_ = 0x219392ef;
      auVar89._0_8_ = 0x219392ef219392ef;
      auVar89._12_4_ = 0x219392ef;
      auVar81 = vcmpps_avx(auVar81,auVar89,1);
      auVar81 = vblendvps_avx((undefined1  [16])aVar4,auVar89,auVar81);
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar89 = vrcpps_avx(auVar81);
      fVar62 = auVar89._0_4_;
      auVar66._0_4_ = fVar62 * auVar81._0_4_;
      fVar63 = auVar89._4_4_;
      auVar66._4_4_ = fVar63 * auVar81._4_4_;
      fVar64 = auVar89._8_4_;
      auVar66._8_4_ = fVar64 * auVar81._8_4_;
      fVar88 = auVar89._12_4_;
      auVar66._12_4_ = fVar88 * auVar81._12_4_;
      auVar90._8_4_ = 0x3f800000;
      auVar90._0_8_ = &DAT_3f8000003f800000;
      auVar90._12_4_ = 0x3f800000;
      auVar81 = vsubps_avx(auVar90,auVar66);
      auVar47._0_4_ = fVar62 + fVar62 * auVar81._0_4_;
      auVar47._4_4_ = fVar63 + fVar63 * auVar81._4_4_;
      auVar47._8_4_ = fVar64 + fVar64 * auVar81._8_4_;
      auVar47._12_4_ = fVar88 + fVar88 * auVar81._12_4_;
      uVar38 = *(undefined4 *)&(ray->org).field_0;
      auVar98._4_4_ = uVar38;
      auVar98._0_4_ = uVar38;
      auVar98._8_4_ = uVar38;
      auVar98._12_4_ = uVar38;
      uVar38 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar101._4_4_ = uVar38;
      auVar101._0_4_ = uVar38;
      auVar101._8_4_ = uVar38;
      auVar101._12_4_ = uVar38;
      uVar38 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar103._4_4_ = uVar38;
      auVar103._0_4_ = uVar38;
      auVar103._8_4_ = uVar38;
      auVar103._12_4_ = uVar38;
      auVar66 = vshufps_avx(auVar47,auVar47,0);
      auVar81 = vmovshdup_avx(auVar47);
      auVar90 = vshufps_avx(auVar47,auVar47,0x55);
      auVar89 = vshufpd_avx(auVar47,auVar47,1);
      uVar40 = (ulong)(auVar47._0_4_ < 0.0) << 4;
      uVar33 = (ulong)(auVar81._0_4_ < 0.0) << 4 | 0x20;
      auVar81 = vshufps_avx(auVar47,auVar47,0xaa);
      uVar34 = (ulong)(auVar89._0_4_ < 0.0) << 4 | 0x40;
      uVar36 = uVar40 ^ 0x10;
      uVar30 = uVar33 ^ 0x10;
      uVar41 = uVar34 ^ 0x10;
      auVar7 = vshufps_avx(auVar7,auVar7,0);
      auVar89 = vshufps_avx(ZEXT416((uint)fVar53),ZEXT416((uint)fVar53),0);
      local_a28 = uVar40;
      local_a30 = uVar33;
      local_a38 = uVar34;
      local_a40 = uVar36;
      local_a48 = uVar30;
      local_a50 = uVar41;
      do {
        if (local_a18 == stack) {
          return;
        }
        sVar39 = local_a18[-1].ptr;
        local_a18 = local_a18 + -1;
        local_a20 = unaff_R12;
        do {
          if ((sVar39 & 8) == 0) {
            uVar25 = sVar39 & 0xfffffffffffffff0;
            fVar53 = (ray->dir).field_0.m128[3];
            auVar46._4_4_ = fVar53;
            auVar46._0_4_ = fVar53;
            auVar46._8_4_ = fVar53;
            auVar46._12_4_ = fVar53;
            pfVar3 = (float *)(uVar25 + 0x80 + uVar40);
            pfVar1 = (float *)(uVar25 + 0x20 + uVar40);
            auVar54._0_4_ = fVar53 * *pfVar3 + *pfVar1;
            auVar54._4_4_ = fVar53 * pfVar3[1] + pfVar1[1];
            auVar54._8_4_ = fVar53 * pfVar3[2] + pfVar1[2];
            auVar54._12_4_ = fVar53 * pfVar3[3] + pfVar1[3];
            auVar47 = vsubps_avx(auVar54,auVar98);
            auVar55._0_4_ = auVar66._0_4_ * auVar47._0_4_;
            auVar55._4_4_ = auVar66._4_4_ * auVar47._4_4_;
            auVar55._8_4_ = auVar66._8_4_ * auVar47._8_4_;
            auVar55._12_4_ = auVar66._12_4_ * auVar47._12_4_;
            auVar47 = vmaxps_avx(auVar7,auVar55);
            pfVar3 = (float *)(uVar25 + 0x80 + uVar33);
            pfVar1 = (float *)(uVar25 + 0x20 + uVar33);
            auVar67._0_4_ = fVar53 * *pfVar3 + *pfVar1;
            auVar67._4_4_ = fVar53 * pfVar3[1] + pfVar1[1];
            auVar67._8_4_ = fVar53 * pfVar3[2] + pfVar1[2];
            auVar67._12_4_ = fVar53 * pfVar3[3] + pfVar1[3];
            auVar54 = vsubps_avx(auVar67,auVar101);
            auVar68._0_4_ = auVar90._0_4_ * auVar54._0_4_;
            auVar68._4_4_ = auVar90._4_4_ * auVar54._4_4_;
            auVar68._8_4_ = auVar90._8_4_ * auVar54._8_4_;
            auVar68._12_4_ = auVar90._12_4_ * auVar54._12_4_;
            pfVar3 = (float *)(uVar25 + 0x80 + uVar34);
            pfVar1 = (float *)(uVar25 + 0x20 + uVar34);
            auVar82._0_4_ = fVar53 * *pfVar3 + *pfVar1;
            auVar82._4_4_ = fVar53 * pfVar3[1] + pfVar1[1];
            auVar82._8_4_ = fVar53 * pfVar3[2] + pfVar1[2];
            auVar82._12_4_ = fVar53 * pfVar3[3] + pfVar1[3];
            auVar54 = vsubps_avx(auVar82,auVar103);
            auVar83._0_4_ = auVar81._0_4_ * auVar54._0_4_;
            auVar83._4_4_ = auVar81._4_4_ * auVar54._4_4_;
            auVar83._8_4_ = auVar81._8_4_ * auVar54._8_4_;
            auVar83._12_4_ = auVar81._12_4_ * auVar54._12_4_;
            auVar54 = vmaxps_avx(auVar68,auVar83);
            auVar47 = vmaxps_avx(auVar47,auVar54);
            pfVar3 = (float *)(uVar25 + 0x80 + uVar36);
            pfVar1 = (float *)(uVar25 + 0x20 + uVar36);
            auVar69._0_4_ = fVar53 * *pfVar3 + *pfVar1;
            auVar69._4_4_ = fVar53 * pfVar3[1] + pfVar1[1];
            auVar69._8_4_ = fVar53 * pfVar3[2] + pfVar1[2];
            auVar69._12_4_ = fVar53 * pfVar3[3] + pfVar1[3];
            auVar54 = vsubps_avx(auVar69,auVar98);
            auVar70._0_4_ = auVar66._0_4_ * auVar54._0_4_;
            auVar70._4_4_ = auVar66._4_4_ * auVar54._4_4_;
            auVar70._8_4_ = auVar66._8_4_ * auVar54._8_4_;
            auVar70._12_4_ = auVar66._12_4_ * auVar54._12_4_;
            pfVar3 = (float *)(uVar25 + 0x80 + uVar30);
            auVar54 = vminps_avx(auVar89,auVar70);
            pfVar1 = (float *)(uVar25 + 0x20 + uVar30);
            auVar84._0_4_ = fVar53 * *pfVar3 + *pfVar1;
            auVar84._4_4_ = fVar53 * pfVar3[1] + pfVar1[1];
            auVar84._8_4_ = fVar53 * pfVar3[2] + pfVar1[2];
            auVar84._12_4_ = fVar53 * pfVar3[3] + pfVar1[3];
            auVar55 = vsubps_avx(auVar84,auVar101);
            pfVar3 = (float *)(uVar25 + 0x80 + uVar41);
            pfVar1 = (float *)(uVar25 + 0x20 + uVar41);
            auVar91._0_4_ = fVar53 * *pfVar3 + *pfVar1;
            auVar91._4_4_ = fVar53 * pfVar3[1] + pfVar1[1];
            auVar91._8_4_ = fVar53 * pfVar3[2] + pfVar1[2];
            auVar91._12_4_ = fVar53 * pfVar3[3] + pfVar1[3];
            auVar85._0_4_ = auVar90._0_4_ * auVar55._0_4_;
            auVar85._4_4_ = auVar90._4_4_ * auVar55._4_4_;
            auVar85._8_4_ = auVar90._8_4_ * auVar55._8_4_;
            auVar85._12_4_ = auVar90._12_4_ * auVar55._12_4_;
            auVar55 = vsubps_avx(auVar91,auVar103);
            auVar92._0_4_ = auVar81._0_4_ * auVar55._0_4_;
            auVar92._4_4_ = auVar81._4_4_ * auVar55._4_4_;
            auVar92._8_4_ = auVar81._8_4_ * auVar55._8_4_;
            auVar92._12_4_ = auVar81._12_4_ * auVar55._12_4_;
            auVar55 = vminps_avx(auVar85,auVar92);
            auVar54 = vminps_avx(auVar54,auVar55);
            if (((uint)sVar39 & 7) == 6) {
              auVar54 = vcmpps_avx(auVar47,auVar54,2);
              auVar47 = vcmpps_avx(*(undefined1 (*) [16])(uVar25 + 0xe0),auVar46,2);
              auVar55 = vcmpps_avx(auVar46,*(undefined1 (*) [16])(uVar25 + 0xf0),1);
              auVar47 = vandps_avx(auVar47,auVar55);
              auVar47 = vandps_avx(auVar47,auVar54);
            }
            else {
              auVar47 = vcmpps_avx(auVar47,auVar54,2);
            }
            auVar47 = vpslld_avx(auVar47,0x1f);
            uVar38 = vmovmskps_avx(auVar47);
            local_a20 = CONCAT44((int)(local_a20 >> 0x20),uVar38);
          }
          if ((sVar39 & 8) == 0) {
            if (local_a20 == 0) {
              iVar31 = 4;
            }
            else {
              uVar25 = sVar39 & 0xfffffffffffffff0;
              lVar28 = 0;
              if (local_a20 != 0) {
                for (; (local_a20 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
                }
              }
              iVar31 = 0;
              sVar39 = *(size_t *)(uVar25 + lVar28 * 8);
              uVar29 = local_a20 - 1 & local_a20;
              if (uVar29 != 0) {
                local_a18->ptr = sVar39;
                lVar28 = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
                  }
                }
                uVar26 = uVar29 - 1;
                while( true ) {
                  local_a18 = local_a18 + 1;
                  sVar39 = *(size_t *)(uVar25 + lVar28 * 8);
                  uVar26 = uVar26 & uVar29;
                  if (uVar26 == 0) break;
                  local_a18->ptr = sVar39;
                  lVar28 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
                    }
                  }
                  uVar29 = uVar26 - 1;
                }
              }
            }
          }
          else {
            iVar31 = 6;
          }
        } while (iVar31 == 0);
        if (iVar31 == 6) {
          iVar31 = 0;
          local_9d8 = (ulong)((uint)sVar39 & 0xf) - 8;
          bVar45 = local_9d8 != 0;
          if (bVar45) {
            uVar40 = sVar39 & 0xfffffffffffffff0;
            scene = context->scene;
            uVar30 = 0;
            do {
              local_9d0 = uVar30;
              lVar27 = uVar30 * 0x50;
              pGVar5 = (scene->geometries).items[*(uint *)(uVar40 + 0x30 + lVar27)].ptr;
              fVar53 = (pGVar5->time_range).lower;
              fVar53 = pGVar5->fnumTimeSegments *
                       (((ray->dir).field_0.m128[3] - fVar53) /
                       ((pGVar5->time_range).upper - fVar53));
              auVar47 = vroundss_avx(ZEXT416((uint)fVar53),ZEXT416((uint)fVar53),9);
              auVar47 = vminss_avx(auVar47,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
              auVar91 = vmaxss_avx(auVar94._0_16_,auVar47);
              lVar32 = (long)(int)auVar91._0_4_ * 0x38;
              uVar33 = (ulong)*(uint *)(uVar40 + 4 + lVar27);
              lVar28 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar32);
              lVar32 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar32);
              auVar47 = *(undefined1 (*) [16])(lVar28 + (ulong)*(uint *)(uVar40 + lVar27) * 4);
              uVar44 = (ulong)*(uint *)(uVar40 + 0x10 + lVar27);
              auVar54 = *(undefined1 (*) [16])(lVar28 + uVar44 * 4);
              uVar36 = (ulong)*(uint *)(uVar40 + 0x20 + lVar27);
              auVar50 = *(undefined1 (*) [16])(lVar28 + uVar36 * 4);
              auVar55 = *(undefined1 (*) [16])(lVar28 + uVar33 * 4);
              uVar25 = (ulong)*(uint *)(uVar40 + 0x14 + lVar27);
              auVar46 = *(undefined1 (*) [16])(lVar28 + uVar25 * 4);
              uVar41 = (ulong)*(uint *)(uVar40 + 0x24 + lVar27);
              auVar51 = *(undefined1 (*) [16])(lVar28 + uVar41 * 4);
              uVar34 = (ulong)*(uint *)(uVar40 + 8 + lVar27);
              auVar67 = *(undefined1 (*) [16])(lVar28 + uVar34 * 4);
              uVar35 = (ulong)*(uint *)(uVar40 + 0x18 + lVar27);
              auVar68 = *(undefined1 (*) [16])(lVar28 + uVar35 * 4);
              uVar29 = (ulong)*(uint *)(uVar40 + 0x28 + lVar27);
              auVar69 = *(undefined1 (*) [16])(lVar28 + uVar29 * 4);
              uVar42 = (ulong)*(uint *)(uVar40 + 0xc + lVar27);
              auVar70 = *(undefined1 (*) [16])(lVar28 + uVar42 * 4);
              uVar37 = (ulong)*(uint *)(uVar40 + 0x1c + lVar27);
              auVar82 = *(undefined1 (*) [16])(lVar28 + uVar37 * 4);
              uVar26 = (ulong)*(uint *)(uVar40 + 0x2c + lVar27);
              auVar83 = *(undefined1 (*) [16])(lVar28 + uVar26 * 4);
              auVar84 = *(undefined1 (*) [16])(lVar32 + (ulong)*(uint *)(uVar40 + lVar27) * 4);
              auVar85 = *(undefined1 (*) [16])(lVar32 + uVar44 * 4);
              fVar53 = fVar53 - auVar91._0_4_;
              auVar91 = vunpcklps_avx(auVar47,auVar67);
              auVar67 = vunpckhps_avx(auVar47,auVar67);
              auVar92 = vunpcklps_avx(auVar55,auVar70);
              auVar55 = vunpckhps_avx(auVar55,auVar70);
              auVar47 = *(undefined1 (*) [16])(lVar32 + uVar33 * 4);
              auVar48 = vunpcklps_avx(auVar67,auVar55);
              auVar49 = vunpcklps_avx(auVar91,auVar92);
              auVar67 = vunpckhps_avx(auVar91,auVar92);
              auVar70 = vunpcklps_avx(auVar54,auVar68);
              auVar55 = vunpckhps_avx(auVar54,auVar68);
              auVar68 = vunpcklps_avx(auVar46,auVar82);
              auVar46 = vunpckhps_avx(auVar46,auVar82);
              auVar54 = *(undefined1 (*) [16])(lVar32 + uVar34 * 4);
              auVar82 = vunpcklps_avx(auVar55,auVar46);
              auVar91 = vunpcklps_avx(auVar70,auVar68);
              auVar46 = vunpckhps_avx(auVar70,auVar68);
              auVar70 = vunpcklps_avx(auVar50,auVar69);
              auVar68 = vunpckhps_avx(auVar50,auVar69);
              auVar92 = vunpcklps_avx(auVar51,auVar83);
              auVar69 = vunpckhps_avx(auVar51,auVar83);
              auVar55 = *(undefined1 (*) [16])(lVar32 + uVar42 * 4);
              auVar83 = vunpcklps_avx(auVar68,auVar69);
              auVar50 = vunpcklps_avx(auVar70,auVar92);
              auVar68 = vunpckhps_avx(auVar70,auVar92);
              auVar69 = vunpcklps_avx(auVar84,auVar54);
              auVar54 = vunpckhps_avx(auVar84,auVar54);
              auVar70 = vunpcklps_avx(auVar47,auVar55);
              auVar55 = vunpckhps_avx(auVar47,auVar55);
              auVar47 = *(undefined1 (*) [16])(lVar32 + uVar35 * 4);
              auVar84 = vunpcklps_avx(auVar54,auVar55);
              auVar92 = vunpcklps_avx(auVar69,auVar70);
              auVar55 = vunpckhps_avx(auVar69,auVar70);
              auVar70 = vunpcklps_avx(auVar85,auVar47);
              auVar69 = vunpckhps_avx(auVar85,auVar47);
              auVar47 = *(undefined1 (*) [16])(lVar32 + uVar25 * 4);
              auVar54 = *(undefined1 (*) [16])(lVar32 + uVar37 * 4);
              auVar85 = vunpcklps_avx(auVar47,auVar54);
              auVar47 = vunpckhps_avx(auVar47,auVar54);
              auVar51 = vunpcklps_avx(auVar69,auVar47);
              auVar57 = vunpcklps_avx(auVar70,auVar85);
              auVar69 = vunpckhps_avx(auVar70,auVar85);
              auVar47 = *(undefined1 (*) [16])(lVar32 + uVar36 * 4);
              auVar54 = *(undefined1 (*) [16])(lVar32 + uVar29 * 4);
              auVar85 = vunpcklps_avx(auVar47,auVar54);
              auVar70 = vunpckhps_avx(auVar47,auVar54);
              auVar47 = *(undefined1 (*) [16])(lVar32 + uVar41 * 4);
              auVar54 = *(undefined1 (*) [16])(lVar32 + uVar26 * 4);
              auVar56 = vunpcklps_avx(auVar47,auVar54);
              auVar47 = vunpckhps_avx(auVar47,auVar54);
              auVar58 = vunpcklps_avx(auVar70,auVar47);
              auVar59 = vunpcklps_avx(auVar85,auVar56);
              auVar70 = vunpckhps_avx(auVar85,auVar56);
              auVar47 = vshufps_avx(ZEXT416((uint)fVar53),ZEXT416((uint)fVar53),0);
              auVar54 = vshufps_avx(ZEXT416((uint)(1.0 - fVar53)),ZEXT416((uint)(1.0 - fVar53)),0);
              fVar53 = auVar47._0_4_;
              fVar62 = auVar47._4_4_;
              fVar63 = auVar47._8_4_;
              fVar64 = auVar47._12_4_;
              fVar88 = auVar54._0_4_;
              fVar120 = auVar54._4_4_;
              fVar121 = auVar54._8_4_;
              fVar122 = auVar54._12_4_;
              auVar117._0_4_ = fVar88 * auVar49._0_4_ + fVar53 * auVar92._0_4_;
              auVar117._4_4_ = fVar120 * auVar49._4_4_ + fVar62 * auVar92._4_4_;
              auVar117._8_4_ = fVar121 * auVar49._8_4_ + fVar63 * auVar92._8_4_;
              auVar117._12_4_ = fVar122 * auVar49._12_4_ + fVar64 * auVar92._12_4_;
              local_9f8._0_4_ = auVar67._0_4_;
              local_9f8._4_4_ = auVar67._4_4_;
              fStack_9f0 = auVar67._8_4_;
              fStack_9ec = auVar67._12_4_;
              local_9f8._0_4_ = fVar88 * (float)local_9f8._0_4_ + fVar53 * auVar55._0_4_;
              local_9f8._4_4_ = fVar120 * (float)local_9f8._4_4_ + fVar62 * auVar55._4_4_;
              fStack_9f0 = fVar121 * fStack_9f0 + fVar63 * auVar55._8_4_;
              fStack_9ec = fVar122 * fStack_9ec + fVar64 * auVar55._12_4_;
              local_8c8 = auVar48._0_4_;
              fStack_8c4 = auVar48._4_4_;
              fStack_8c0 = auVar48._8_4_;
              fStack_8bc = auVar48._12_4_;
              auVar99._0_4_ = fVar88 * local_8c8 + fVar53 * auVar84._0_4_;
              auVar99._4_4_ = fVar120 * fStack_8c4 + fVar62 * auVar84._4_4_;
              auVar99._8_4_ = fVar121 * fStack_8c0 + fVar63 * auVar84._8_4_;
              auVar99._12_4_ = fVar122 * fStack_8bc + fVar64 * auVar84._12_4_;
              auVar56._0_4_ = fVar88 * auVar91._0_4_ + fVar53 * auVar57._0_4_;
              auVar56._4_4_ = fVar120 * auVar91._4_4_ + fVar62 * auVar57._4_4_;
              auVar56._8_4_ = fVar121 * auVar91._8_4_ + fVar63 * auVar57._8_4_;
              auVar56._12_4_ = fVar122 * auVar91._12_4_ + fVar64 * auVar57._12_4_;
              local_8d8 = auVar46._0_4_;
              fStack_8d4 = auVar46._4_4_;
              fStack_8d0 = auVar46._8_4_;
              fStack_8cc = auVar46._12_4_;
              auVar71._0_4_ = fVar88 * local_8d8 + fVar53 * auVar69._0_4_;
              auVar71._4_4_ = fVar120 * fStack_8d4 + fVar62 * auVar69._4_4_;
              auVar71._8_4_ = fVar121 * fStack_8d0 + fVar63 * auVar69._8_4_;
              auVar71._12_4_ = fVar122 * fStack_8cc + fVar64 * auVar69._12_4_;
              puVar2 = (undefined8 *)(uVar40 + 0x30 + lVar27);
              local_8a8 = *puVar2;
              uStack_8a0 = puVar2[1];
              puVar2 = (undefined8 *)(uVar40 + 0x40 + lVar27);
              local_a08._0_4_ = auVar82._0_4_;
              local_a08._4_4_ = auVar82._4_4_;
              uStack_a00._0_4_ = auVar82._8_4_;
              uStack_a00._4_4_ = auVar82._12_4_;
              auVar108._0_4_ = fVar88 * (float)local_a08._0_4_ + auVar51._0_4_ * fVar53;
              auVar108._4_4_ = fVar120 * (float)local_a08._4_4_ + auVar51._4_4_ * fVar62;
              auVar108._8_4_ = fVar121 * (float)uStack_a00 + auVar51._8_4_ * fVar63;
              auVar108._12_4_ = fVar122 * uStack_a00._4_4_ + auVar51._12_4_ * fVar64;
              local_9e8._0_4_ = auVar50._0_4_;
              local_9e8._4_4_ = auVar50._4_4_;
              fStack_9e0 = auVar50._8_4_;
              fStack_9dc = auVar50._12_4_;
              auVar115._0_4_ = fVar88 * (float)local_9e8._0_4_ + auVar59._0_4_ * fVar53;
              auVar115._4_4_ = fVar120 * (float)local_9e8._4_4_ + auVar59._4_4_ * fVar62;
              auVar115._8_4_ = fVar121 * fStack_9e0 + auVar59._8_4_ * fVar63;
              auVar115._12_4_ = fVar122 * fStack_9dc + auVar59._12_4_ * fVar64;
              local_a88._0_4_ = auVar68._0_4_;
              local_a88._4_4_ = auVar68._4_4_;
              fStack_a80 = auVar68._8_4_;
              fStack_a7c = auVar68._12_4_;
              auVar116._0_4_ = auVar70._0_4_ * fVar53 + fVar88 * (float)local_a88._0_4_;
              auVar116._4_4_ = auVar70._4_4_ * fVar62 + fVar120 * (float)local_a88._4_4_;
              auVar116._8_4_ = auVar70._8_4_ * fVar63 + fVar121 * fStack_a80;
              auVar116._12_4_ = auVar70._12_4_ * fVar64 + fVar122 * fStack_a7c;
              local_a78._0_4_ = auVar83._0_4_;
              local_a78._4_4_ = auVar83._4_4_;
              fStack_a70 = auVar83._8_4_;
              fStack_a6c = auVar83._12_4_;
              auVar48._0_4_ = fVar88 * (float)local_a78._0_4_ + auVar58._0_4_ * fVar53;
              auVar48._4_4_ = fVar120 * (float)local_a78._4_4_ + auVar58._4_4_ * fVar62;
              auVar48._8_4_ = fVar121 * fStack_a70 + auVar58._8_4_ * fVar63;
              auVar48._12_4_ = fVar122 * fStack_a6c + auVar58._12_4_ * fVar64;
              local_8b8 = *puVar2;
              uStack_8b0 = puVar2[1];
              auVar47 = vsubps_avx(auVar117,auVar56);
              auVar54 = vsubps_avx(_local_9f8,auVar71);
              auVar55 = vsubps_avx(auVar99,auVar108);
              auVar46 = vsubps_avx(auVar115,auVar117);
              auVar67 = vsubps_avx(auVar116,_local_9f8);
              auVar68 = vsubps_avx(auVar48,auVar99);
              fVar64 = auVar68._0_4_;
              fVar102 = auVar54._0_4_;
              auVar49._0_4_ = fVar102 * fVar64;
              fVar8 = auVar68._4_4_;
              fVar104 = auVar54._4_4_;
              auVar49._4_4_ = fVar104 * fVar8;
              fVar13 = auVar68._8_4_;
              fVar105 = auVar54._8_4_;
              auVar49._8_4_ = fVar105 * fVar13;
              fVar18 = auVar68._12_4_;
              fVar106 = auVar54._12_4_;
              auVar49._12_4_ = fVar106 * fVar18;
              fVar88 = auVar67._0_4_;
              fVar107 = auVar55._0_4_;
              auVar57._0_4_ = fVar107 * fVar88;
              fVar9 = auVar67._4_4_;
              fVar109 = auVar55._4_4_;
              auVar57._4_4_ = fVar109 * fVar9;
              fVar14 = auVar67._8_4_;
              fVar111 = auVar55._8_4_;
              auVar57._8_4_ = fVar111 * fVar14;
              fVar19 = auVar67._12_4_;
              fVar113 = auVar55._12_4_;
              auVar57._12_4_ = fVar113 * fVar19;
              local_a68 = vsubps_avx(auVar57,auVar49);
              fVar120 = auVar46._0_4_;
              auVar58._0_4_ = fVar107 * fVar120;
              fVar10 = auVar46._4_4_;
              auVar58._4_4_ = fVar109 * fVar10;
              fVar15 = auVar46._8_4_;
              auVar58._8_4_ = fVar111 * fVar15;
              fVar20 = auVar46._12_4_;
              auVar58._12_4_ = fVar113 * fVar20;
              fVar121 = auVar47._0_4_;
              auVar72._0_4_ = fVar64 * fVar121;
              fVar11 = auVar47._4_4_;
              auVar72._4_4_ = fVar8 * fVar11;
              fVar16 = auVar47._8_4_;
              auVar72._8_4_ = fVar13 * fVar16;
              fVar21 = auVar47._12_4_;
              auVar72._12_4_ = fVar18 * fVar21;
              local_7f8 = vsubps_avx(auVar72,auVar58);
              auVar73._0_4_ = fVar88 * fVar121;
              auVar73._4_4_ = fVar9 * fVar11;
              auVar73._8_4_ = fVar14 * fVar16;
              auVar73._12_4_ = fVar19 * fVar21;
              auVar86._0_4_ = fVar102 * fVar120;
              auVar86._4_4_ = fVar104 * fVar10;
              auVar86._8_4_ = fVar105 * fVar15;
              auVar86._12_4_ = fVar106 * fVar20;
              _local_a08 = vsubps_avx(auVar86,auVar73);
              uVar38 = *(undefined4 *)&(ray->org).field_0;
              auVar50._4_4_ = uVar38;
              auVar50._0_4_ = uVar38;
              auVar50._8_4_ = uVar38;
              auVar50._12_4_ = uVar38;
              uVar38 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar118._4_4_ = uVar38;
              auVar118._0_4_ = uVar38;
              auVar118._8_4_ = uVar38;
              auVar118._12_4_ = uVar38;
              uVar38 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar123._4_4_ = uVar38;
              auVar123._0_4_ = uVar38;
              auVar123._8_4_ = uVar38;
              auVar123._12_4_ = uVar38;
              fVar53 = (ray->dir).field_0.m128[1];
              _local_a78 = vsubps_avx(auVar117,auVar50);
              fVar62 = (ray->dir).field_0.m128[2];
              _local_a88 = vsubps_avx(_local_9f8,auVar118);
              _local_9e8 = vsubps_avx(auVar99,auVar123);
              fVar122 = local_9e8._0_4_;
              auVar100._0_4_ = fVar53 * fVar122;
              fVar12 = local_9e8._4_4_;
              auVar100._4_4_ = fVar53 * fVar12;
              fVar17 = local_9e8._8_4_;
              auVar100._8_4_ = fVar53 * fVar17;
              fVar22 = local_9e8._12_4_;
              auVar100._12_4_ = fVar53 * fVar22;
              fVar93 = local_a88._0_4_;
              auVar119._0_4_ = fVar93 * fVar62;
              fVar95 = local_a88._4_4_;
              auVar119._4_4_ = fVar95 * fVar62;
              fVar96 = local_a88._8_4_;
              auVar119._8_4_ = fVar96 * fVar62;
              fVar97 = local_a88._12_4_;
              auVar119._12_4_ = fVar97 * fVar62;
              auVar54 = vsubps_avx(auVar119,auVar100);
              fVar63 = (ray->dir).field_0.m128[0];
              fVar65 = local_a78._0_4_;
              auVar124._0_4_ = fVar65 * fVar62;
              fVar78 = local_a78._4_4_;
              auVar124._4_4_ = fVar78 * fVar62;
              fVar79 = local_a78._8_4_;
              auVar124._8_4_ = fVar79 * fVar62;
              fVar80 = local_a78._12_4_;
              auVar124._12_4_ = fVar80 * fVar62;
              auVar59._0_4_ = fVar63 * fVar122;
              auVar59._4_4_ = fVar63 * fVar12;
              auVar59._8_4_ = fVar63 * fVar17;
              auVar59._12_4_ = fVar63 * fVar22;
              auVar55 = vsubps_avx(auVar59,auVar124);
              auVar125._0_4_ = fVar63 * fVar93;
              auVar125._4_4_ = fVar63 * fVar95;
              auVar125._8_4_ = fVar63 * fVar96;
              auVar125._12_4_ = fVar63 * fVar97;
              auVar74._0_4_ = fVar53 * fVar65;
              auVar74._4_4_ = fVar53 * fVar78;
              auVar74._8_4_ = fVar53 * fVar79;
              auVar74._12_4_ = fVar53 * fVar80;
              auVar46 = vsubps_avx(auVar74,auVar125);
              auVar67 = _local_a08;
              auVar51._0_4_ =
                   local_a68._0_4_ * fVar63 + fVar53 * local_7f8._0_4_ + local_a08._0_4_ * fVar62;
              auVar51._4_4_ =
                   local_a68._4_4_ * fVar63 + fVar53 * local_7f8._4_4_ + local_a08._4_4_ * fVar62;
              auVar51._8_4_ =
                   local_a68._8_4_ * fVar63 + fVar53 * local_7f8._8_4_ + local_a08._8_4_ * fVar62;
              auVar51._12_4_ =
                   local_a68._12_4_ * fVar63 + fVar53 * local_7f8._12_4_ + local_a08._12_4_ * fVar62
              ;
              auVar75._8_8_ = 0x8000000080000000;
              auVar75._0_8_ = 0x8000000080000000;
              auVar47 = vandps_avx(auVar51,auVar75);
              uVar43 = auVar47._0_4_;
              local_898._0_4_ =
                   (float)(uVar43 ^ (uint)(fVar120 * auVar54._0_4_ +
                                          fVar88 * auVar55._0_4_ + fVar64 * auVar46._0_4_));
              uVar110 = auVar47._4_4_;
              local_898._4_4_ =
                   (float)(uVar110 ^
                          (uint)(fVar10 * auVar54._4_4_ +
                                fVar9 * auVar55._4_4_ + fVar8 * auVar46._4_4_));
              uVar112 = auVar47._8_4_;
              local_898._8_4_ =
                   (float)(uVar112 ^
                          (uint)(fVar15 * auVar54._8_4_ +
                                fVar14 * auVar55._8_4_ + fVar13 * auVar46._8_4_));
              uVar114 = auVar47._12_4_;
              local_898._12_4_ =
                   (float)(uVar114 ^
                          (uint)(fVar20 * auVar54._12_4_ +
                                fVar19 * auVar55._12_4_ + fVar18 * auVar46._12_4_));
              local_888._0_4_ =
                   (float)(uVar43 ^ (uint)(fVar121 * auVar54._0_4_ +
                                          fVar102 * auVar55._0_4_ + fVar107 * auVar46._0_4_));
              local_888._4_4_ =
                   (float)(uVar110 ^
                          (uint)(fVar11 * auVar54._4_4_ +
                                fVar104 * auVar55._4_4_ + fVar109 * auVar46._4_4_));
              local_888._8_4_ =
                   (float)(uVar112 ^
                          (uint)(fVar16 * auVar54._8_4_ +
                                fVar105 * auVar55._8_4_ + fVar111 * auVar46._8_4_));
              local_888._12_4_ =
                   (float)(uVar114 ^
                          (uint)(fVar21 * auVar54._12_4_ +
                                fVar106 * auVar55._12_4_ + fVar113 * auVar46._12_4_));
              auVar55 = ZEXT416(0) << 0x20;
              auVar47 = vcmpps_avx(local_898,auVar55,5);
              auVar54 = vcmpps_avx(local_888,auVar55,5);
              auVar47 = vandps_avx(auVar47,auVar54);
              auVar76._8_4_ = 0x7fffffff;
              auVar76._0_8_ = 0x7fffffff7fffffff;
              auVar76._12_4_ = 0x7fffffff;
              local_868 = vandps_avx(auVar51,auVar76);
              auVar54 = vcmpps_avx(auVar55,auVar51,4);
              auVar47 = vandps_avx(auVar47,auVar54);
              auVar60._0_4_ = local_898._0_4_ + local_888._0_4_;
              auVar60._4_4_ = local_898._4_4_ + local_888._4_4_;
              auVar60._8_4_ = local_898._8_4_ + local_888._8_4_;
              auVar60._12_4_ = local_898._12_4_ + local_888._12_4_;
              auVar54 = vcmpps_avx(auVar60,local_868,2);
              auVar47 = vandps_avx(auVar47,auVar54);
              auVar54 = auVar24 & auVar47;
              if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar54[0xf] < '\0') {
                auVar47 = vandps_avx(auVar47,auVar24);
                local_878._0_4_ =
                     (float)(uVar43 ^ (uint)(local_a68._0_4_ * fVar65 +
                                            local_7f8._0_4_ * fVar93 + fVar122 * local_a08._0_4_));
                local_878._4_4_ =
                     (float)(uVar110 ^
                            (uint)(local_a68._4_4_ * fVar78 +
                                  local_7f8._4_4_ * fVar95 + fVar12 * local_a08._4_4_));
                local_878._8_4_ =
                     (float)(uVar112 ^
                            (uint)(local_a68._8_4_ * fVar79 +
                                  local_7f8._8_4_ * fVar96 + fVar17 * local_a08._8_4_));
                local_878._12_4_ =
                     (float)(uVar114 ^
                            (uint)(local_a68._12_4_ * fVar80 +
                                  local_7f8._12_4_ * fVar97 + fVar22 * local_a08._12_4_));
                fVar53 = (ray->org).field_0.m128[3];
                fVar62 = local_868._0_4_;
                auVar52._0_4_ = fVar62 * fVar53;
                fVar63 = local_868._4_4_;
                auVar52._4_4_ = fVar63 * fVar53;
                fVar64 = local_868._8_4_;
                auVar52._8_4_ = fVar64 * fVar53;
                fVar88 = local_868._12_4_;
                auVar52._12_4_ = fVar88 * fVar53;
                auVar54 = vcmpps_avx(auVar52,local_878,1);
                fVar53 = ray->tfar;
                auVar61._0_4_ = fVar62 * fVar53;
                auVar61._4_4_ = fVar63 * fVar53;
                auVar61._8_4_ = fVar64 * fVar53;
                auVar61._12_4_ = fVar88 * fVar53;
                auVar55 = vcmpps_avx(local_878,auVar61,2);
                auVar54 = vandps_avx(auVar55,auVar54);
                auVar55 = auVar47 & auVar54;
                if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar55[0xf] < '\0') {
                  local_848 = vandps_avx(auVar47,auVar54);
                  local_808 = local_a68;
                  local_7e8 = local_a08;
                  uStack_7e0 = uStack_a00;
                  auVar47 = vrcpps_avx(local_868);
                  fVar53 = auVar47._0_4_;
                  auVar77._0_4_ = fVar62 * fVar53;
                  fVar62 = auVar47._4_4_;
                  auVar77._4_4_ = fVar63 * fVar62;
                  fVar63 = auVar47._8_4_;
                  auVar77._8_4_ = fVar64 * fVar63;
                  fVar64 = auVar47._12_4_;
                  auVar77._12_4_ = fVar88 * fVar64;
                  auVar87._8_4_ = 0x3f800000;
                  auVar87._0_8_ = &DAT_3f8000003f800000;
                  auVar87._12_4_ = 0x3f800000;
                  auVar47 = vsubps_avx(auVar87,auVar77);
                  fVar53 = fVar53 + fVar53 * auVar47._0_4_;
                  fVar62 = fVar62 + fVar62 * auVar47._4_4_;
                  fVar63 = fVar63 + fVar63 * auVar47._8_4_;
                  fVar64 = fVar64 + fVar64 * auVar47._12_4_;
                  local_818[0] = fVar53 * local_878._0_4_;
                  local_818[1] = fVar62 * local_878._4_4_;
                  local_818[2] = fVar63 * local_878._8_4_;
                  local_818[3] = fVar64 * local_878._12_4_;
                  local_838._0_4_ = fVar53 * local_898._0_4_;
                  local_838._4_4_ = fVar62 * local_898._4_4_;
                  local_838._8_4_ = fVar63 * local_898._8_4_;
                  local_838._12_4_ = fVar64 * local_898._12_4_;
                  local_828._0_4_ = fVar53 * local_888._0_4_;
                  local_828._4_4_ = fVar62 * local_888._4_4_;
                  local_828._8_4_ = fVar63 * local_888._8_4_;
                  local_828._12_4_ = fVar64 * local_888._12_4_;
                  uVar43 = vmovmskps_avx(local_848);
                  uVar33 = (ulong)uVar43;
                  _local_a08 = auVar67;
                  do {
                    uVar34 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                      }
                    }
                    h.geomID = *(uint *)((long)&local_8a8 + uVar34 * 4);
                    pGVar5 = (scene->geometries).items[h.geomID].ptr;
                    if ((pGVar5->mask & ray->mask) == 0) {
                      uVar33 = uVar33 ^ 1L << (uVar34 & 0x3f);
                      bVar23 = true;
                    }
                    else {
                      pRVar6 = context->args;
                      if ((pRVar6->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar23 = false;
                      }
                      else {
                        args.context = context->user;
                        h.Ng.field_0.field_0.x = *(float *)(local_808 + uVar34 * 4);
                        h.Ng.field_0.field_0.y = *(float *)(local_7f8 + uVar34 * 4);
                        h.Ng.field_0.field_0.z = *(float *)((long)&local_7e8 + uVar34 * 4);
                        h.u = *(float *)(local_838 + uVar34 * 4);
                        h.v = local_818[uVar34 - 4];
                        h.primID = *(uint *)((long)&local_8b8 + uVar34 * 4);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        local_a68._0_4_ = ray->tfar;
                        ray->tfar = local_818[uVar34];
                        local_a8c = -1;
                        args.valid = &local_a8c;
                        args.geometryUserPtr = pGVar5->userPtr;
                        args.ray = (RTCRayN *)ray;
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        if ((pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*pGVar5->occlusionFilterN)(&args), *args.valid != 0)) {
                          if (pRVar6->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar6->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar6->filter)(&args);
                            }
                            if (*args.valid == 0) goto LAB_002d9a1c;
                          }
                          bVar23 = false;
                        }
                        else {
LAB_002d9a1c:
                          ray->tfar = (float)local_a68._0_4_;
                          uVar33 = uVar33 ^ 1L << (uVar34 & 0x3f);
                          bVar23 = true;
                        }
                      }
                    }
                    if (!bVar23) {
                      auVar94 = ZEXT1664(ZEXT816(0) << 0x40);
                      iVar31 = 0;
                      uVar30 = local_a48;
                      uVar40 = local_a28;
                      uVar33 = local_a30;
                      uVar34 = local_a38;
                      uVar36 = local_a40;
                      uVar41 = local_a50;
                      if (bVar45) {
                        ray->tfar = -INFINITY;
                        iVar31 = 3;
                      }
                      goto LAB_002d9abf;
                    }
                  } while (uVar33 != 0);
                }
              }
              uVar30 = uVar30 + 1;
              bVar45 = uVar30 < local_9d8;
              auVar94 = ZEXT1664(ZEXT816(0) << 0x40);
            } while (uVar30 != local_9d8);
            iVar31 = 0;
            uVar30 = local_a48;
            uVar40 = local_a28;
            uVar33 = local_a30;
            uVar34 = local_a38;
            uVar36 = local_a40;
            uVar41 = local_a50;
          }
        }
LAB_002d9abf:
        unaff_R12 = local_a20;
      } while (iVar31 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }